

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  Geometry *this;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  byte bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar40;
  bool bVar41;
  long lVar42;
  ulong *puVar43;
  byte bVar44;
  size_t i;
  long lVar45;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar46;
  byte bVar47;
  size_t sVar48;
  long lVar49;
  bool bVar50;
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar81 [64];
  long lStack_2500;
  undefined1 local_24e8 [16];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar52 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_24e8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar5 = (context->query_radius).field_0;
    local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
  }
  pSVar46 = stack + 1;
  fVar1 = (query->p).field_0.field_0.x;
  auVar76._4_4_ = fVar1;
  auVar76._0_4_ = fVar1;
  auVar76._8_4_ = fVar1;
  auVar76._12_4_ = fVar1;
  auVar76._16_4_ = fVar1;
  auVar76._20_4_ = fVar1;
  auVar76._24_4_ = fVar1;
  auVar76._28_4_ = fVar1;
  fVar2 = (query->p).field_0.field_0.y;
  auVar77._4_4_ = fVar2;
  auVar77._0_4_ = fVar2;
  auVar77._8_4_ = fVar2;
  auVar77._12_4_ = fVar2;
  auVar77._16_4_ = fVar2;
  auVar77._20_4_ = fVar2;
  auVar77._24_4_ = fVar2;
  auVar77._28_4_ = fVar2;
  fVar3 = (query->p).field_0.field_0.z;
  auVar78._4_4_ = fVar3;
  auVar78._0_4_ = fVar3;
  auVar78._8_4_ = fVar3;
  auVar78._12_4_ = fVar3;
  auVar78._16_4_ = fVar3;
  auVar78._20_4_ = fVar3;
  auVar78._24_4_ = fVar3;
  auVar78._28_4_ = fVar3;
  uVar4 = *(undefined4 *)&(context->query_radius).field_0;
  auVar59._4_4_ = uVar4;
  auVar59._0_4_ = uVar4;
  auVar59._8_4_ = uVar4;
  auVar59._12_4_ = uVar4;
  auVar59._16_4_ = uVar4;
  auVar59._20_4_ = uVar4;
  auVar59._24_4_ = uVar4;
  auVar59._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar65._4_4_ = uVar4;
  auVar65._0_4_ = uVar4;
  auVar65._8_4_ = uVar4;
  auVar65._12_4_ = uVar4;
  auVar65._16_4_ = uVar4;
  auVar65._20_4_ = uVar4;
  auVar65._24_4_ = uVar4;
  auVar65._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar54._4_4_ = uVar4;
  auVar54._0_4_ = uVar4;
  auVar54._8_4_ = uVar4;
  auVar54._12_4_ = uVar4;
  auVar54._16_4_ = uVar4;
  auVar54._20_4_ = uVar4;
  auVar54._24_4_ = uVar4;
  auVar54._28_4_ = uVar4;
  bVar41 = false;
  auVar27 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar79 = ZEXT3264(auVar27);
  auVar80 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar27 = vsubps_avx(auVar76,auVar59);
    fVar18 = auVar59._0_4_;
    fVar19 = auVar59._4_4_;
    fVar20 = auVar59._8_4_;
    fVar21 = auVar59._12_4_;
    fVar22 = auVar59._16_4_;
    fVar23 = auVar59._20_4_;
    fVar24 = auVar59._24_4_;
    auVar25 = vsubps_avx(auVar77,auVar65);
    auVar26 = vsubps_avx(auVar78,auVar54);
    auVar66._0_4_ = fVar3 + auVar54._0_4_;
    auVar66._4_4_ = fVar3 + auVar54._4_4_;
    auVar66._8_4_ = fVar3 + auVar54._8_4_;
    auVar66._12_4_ = fVar3 + auVar54._12_4_;
    auVar66._16_4_ = fVar3 + auVar54._16_4_;
    auVar66._20_4_ = fVar3 + auVar54._20_4_;
    auVar66._24_4_ = fVar3 + auVar54._24_4_;
    auVar66._28_4_ = fVar3 + auVar54._28_4_;
    auVar81._0_4_ = fVar18 * fVar18;
    auVar81._4_4_ = fVar19 * fVar19;
    auVar81._8_4_ = fVar20 * fVar20;
    auVar81._12_4_ = fVar21 * fVar21;
    auVar81._16_4_ = fVar22 * fVar22;
    auVar81._20_4_ = fVar23 * fVar23;
    auVar81._28_36_ = in_ZMM15._28_36_;
    auVar81._24_4_ = fVar24 * fVar24;
LAB_01c79bbd:
    do {
      if (pSVar46 == stack) {
        return bVar41;
      }
      pSVar40 = pSVar46 + -1;
      pSVar46 = pSVar46 + -1;
    } while ((float)local_24e8._0_4_ < (float)pSVar40->dist);
    sVar48 = (pSVar46->ptr).ptr;
LAB_01c79bdb:
    while (context->query_type != POINT_QUERY_TYPE_SPHERE) {
      if ((sVar48 & 8) != 0) goto LAB_01c7a0e6;
      puVar43 = (ulong *)((sVar48 & 0xfffffffffffffff0) + 0x40);
      if ((sVar48 & 0xfffffffffffffff0) == 0) {
        puVar43 = (ulong *)0x0;
      }
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *puVar43;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = puVar43[1];
      uVar35 = vpcmpub_avx512vl(auVar58,auVar64,2);
      uVar4 = (undefined4)puVar43[6];
      auVar69._4_4_ = uVar4;
      auVar69._0_4_ = uVar4;
      auVar69._8_4_ = uVar4;
      auVar69._12_4_ = uVar4;
      auVar69._16_4_ = uVar4;
      auVar69._20_4_ = uVar4;
      auVar69._24_4_ = uVar4;
      auVar69._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)puVar43 + 0x3c);
      auVar72._4_4_ = uVar4;
      auVar72._0_4_ = uVar4;
      auVar72._8_4_ = uVar4;
      auVar72._12_4_ = uVar4;
      auVar72._16_4_ = uVar4;
      auVar72._20_4_ = uVar4;
      auVar72._24_4_ = uVar4;
      auVar72._28_4_ = uVar4;
      auVar54 = vpmovzxbd_avx2(auVar58);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar6 = vfmadd213ps_fma(auVar54,auVar72,auVar69);
      auVar54 = vpmovzxbd_avx2(auVar64);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar7 = vfmadd213ps_fma(auVar54,auVar72,auVar69);
      uVar4 = *(undefined4 *)((long)puVar43 + 0x34);
      auVar62._4_4_ = uVar4;
      auVar62._0_4_ = uVar4;
      auVar62._8_4_ = uVar4;
      auVar62._12_4_ = uVar4;
      auVar62._16_4_ = uVar4;
      auVar62._20_4_ = uVar4;
      auVar62._24_4_ = uVar4;
      auVar62._28_4_ = uVar4;
      uVar4 = (undefined4)puVar43[8];
      auVar70._4_4_ = uVar4;
      auVar70._0_4_ = uVar4;
      auVar70._8_4_ = uVar4;
      auVar70._12_4_ = uVar4;
      auVar70._16_4_ = uVar4;
      auVar70._20_4_ = uVar4;
      auVar70._24_4_ = uVar4;
      auVar70._28_4_ = uVar4;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = puVar43[2];
      auVar54 = vpmovzxbd_avx2(auVar37);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar8 = vfmadd213ps_fma(auVar54,auVar70,auVar62);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = puVar43[3];
      auVar54 = vpmovzxbd_avx2(auVar38);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar9 = vfmadd213ps_fma(auVar54,auVar70,auVar62);
      uVar4 = (undefined4)puVar43[7];
      auVar63._4_4_ = uVar4;
      auVar63._0_4_ = uVar4;
      auVar63._8_4_ = uVar4;
      auVar63._12_4_ = uVar4;
      auVar63._16_4_ = uVar4;
      auVar63._20_4_ = uVar4;
      auVar63._24_4_ = uVar4;
      auVar63._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)puVar43 + 0x44);
      auVar71._4_4_ = uVar4;
      auVar71._0_4_ = uVar4;
      auVar71._8_4_ = uVar4;
      auVar71._12_4_ = uVar4;
      auVar71._16_4_ = uVar4;
      auVar71._20_4_ = uVar4;
      auVar71._24_4_ = uVar4;
      auVar71._28_4_ = uVar4;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = puVar43[4];
      auVar54 = vpmovzxbd_avx2(auVar10);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar37 = vfmadd213ps_fma(auVar54,auVar71,auVar63);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = puVar43[5];
      auVar54 = vpmovzxbd_avx2(auVar11);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar38 = vfmadd213ps_fma(auVar54,auVar71,auVar63);
      auVar52 = ZEXT1632(auVar6);
      auVar54 = vmaxps_avx(auVar76,auVar52);
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar7));
      auVar60 = vsubps_avx(auVar54,auVar76);
      auVar54 = vmaxps_avx(auVar77,ZEXT1632(auVar8));
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar9));
      auVar51 = vsubps_avx(auVar54,auVar77);
      auVar54 = vmaxps_avx(auVar78,ZEXT1632(auVar37));
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar38));
      auVar54 = vsubps_avx(auVar54,auVar78);
      auVar61._0_4_ =
           auVar60._0_4_ * auVar60._0_4_ + auVar51._0_4_ * auVar51._0_4_ +
           auVar54._0_4_ * auVar54._0_4_;
      auVar61._4_4_ =
           auVar60._4_4_ * auVar60._4_4_ + auVar51._4_4_ * auVar51._4_4_ +
           auVar54._4_4_ * auVar54._4_4_;
      auVar61._8_4_ =
           auVar60._8_4_ * auVar60._8_4_ + auVar51._8_4_ * auVar51._8_4_ +
           auVar54._8_4_ * auVar54._8_4_;
      auVar61._12_4_ =
           auVar60._12_4_ * auVar60._12_4_ + auVar51._12_4_ * auVar51._12_4_ +
           auVar54._12_4_ * auVar54._12_4_;
      auVar61._16_4_ =
           auVar60._16_4_ * auVar60._16_4_ + auVar51._16_4_ * auVar51._16_4_ +
           auVar54._16_4_ * auVar54._16_4_;
      auVar61._20_4_ =
           auVar60._20_4_ * auVar60._20_4_ + auVar51._20_4_ * auVar51._20_4_ +
           auVar54._20_4_ * auVar54._20_4_;
      auVar61._24_4_ =
           auVar60._24_4_ * auVar60._24_4_ + auVar51._24_4_ * auVar51._24_4_ +
           auVar54._24_4_ * auVar54._24_4_;
      auVar61._28_4_ = auVar60._28_4_ + auVar51._28_4_ + auVar51._28_4_;
      uVar28 = vcmpps_avx512vl(ZEXT1632(auVar7),auVar27,1);
      auVar39._4_4_ = fVar1 + fVar19;
      auVar39._0_4_ = fVar1 + fVar18;
      auVar39._8_4_ = fVar1 + fVar20;
      auVar39._12_4_ = fVar1 + fVar21;
      auVar39._16_4_ = fVar1 + fVar22;
      auVar39._20_4_ = fVar1 + fVar23;
      auVar39._24_4_ = fVar1 + fVar24;
      auVar39._28_4_ = fVar1 + auVar59._28_4_;
      uVar29 = vcmpps_avx512vl(auVar52,auVar39,6);
      auVar56._4_4_ = fVar2 + auVar65._4_4_;
      auVar56._0_4_ = fVar2 + auVar65._0_4_;
      auVar56._8_4_ = fVar2 + auVar65._8_4_;
      auVar56._12_4_ = fVar2 + auVar65._12_4_;
      auVar56._16_4_ = fVar2 + auVar65._16_4_;
      auVar56._20_4_ = fVar2 + auVar65._20_4_;
      auVar56._24_4_ = fVar2 + auVar65._24_4_;
      auVar56._28_4_ = fVar2 + auVar65._28_4_;
      uVar34 = vcmpps_avx512vl(ZEXT1632(auVar8),auVar56,6);
      uVar30 = vcmpps_avx512vl(ZEXT1632(auVar9),auVar25,1);
      uVar31 = vcmpps_avx512vl(ZEXT1632(auVar38),auVar26,1);
      uVar32 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar66,6);
      uVar33 = vcmpps_avx512vl(auVar52,ZEXT1632(auVar7),2);
      bVar44 = (byte)uVar35 & (byte)uVar33 &
               ~((byte)uVar29 | (byte)uVar28 | (byte)uVar34 | (byte)uVar30 | (byte)uVar32 |
                (byte)uVar31);
LAB_01c79ce4:
      if (bVar44 == 0) goto LAB_01c79bbd;
      auVar54 = *(undefined1 (*) [32])(sVar48 & 0xfffffffffffffff0);
      auVar60 = ((undefined1 (*) [32])(sVar48 & 0xfffffffffffffff0))[1];
      auVar51 = vpternlogd_avx512vl(auVar79._0_32_,auVar61,auVar80._0_32_,0xf8);
      auVar52 = vpcompressd_avx512vl(auVar51);
      auVar53._0_4_ = (uint)(bVar44 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar51._0_4_
      ;
      bVar50 = (bool)(bVar44 >> 1 & 1);
      auVar53._4_4_ = (uint)bVar50 * auVar52._4_4_ | (uint)!bVar50 * auVar51._4_4_;
      bVar50 = (bool)(bVar44 >> 2 & 1);
      auVar53._8_4_ = (uint)bVar50 * auVar52._8_4_ | (uint)!bVar50 * auVar51._8_4_;
      bVar50 = (bool)(bVar44 >> 3 & 1);
      auVar53._12_4_ = (uint)bVar50 * auVar52._12_4_ | (uint)!bVar50 * auVar51._12_4_;
      bVar50 = (bool)(bVar44 >> 4 & 1);
      auVar53._16_4_ = (uint)bVar50 * auVar52._16_4_ | (uint)!bVar50 * auVar51._16_4_;
      bVar50 = (bool)(bVar44 >> 5 & 1);
      auVar53._20_4_ = (uint)bVar50 * auVar52._20_4_ | (uint)!bVar50 * auVar51._20_4_;
      bVar50 = (bool)(bVar44 >> 6 & 1);
      auVar53._24_4_ = (uint)bVar50 * auVar52._24_4_ | (uint)!bVar50 * auVar51._24_4_;
      auVar53._28_4_ =
           (uint)(bVar44 >> 7) * auVar52._28_4_ | (uint)!(bool)(bVar44 >> 7) * auVar51._28_4_;
      auVar51 = vpermt2q_avx512vl(auVar54,auVar53,auVar60);
      sVar48 = auVar51._0_8_;
      bVar44 = bVar44 - 1 & bVar44;
      if (bVar44 != 0) goto LAB_01c79e8a;
    }
    if ((sVar48 & 8) == 0) {
      puVar43 = (ulong *)((sVar48 & 0xfffffffffffffff0) + 0x40);
      if ((sVar48 & 0xfffffffffffffff0) == 0) {
        puVar43 = (ulong *)0x0;
      }
      uVar4 = (undefined4)puVar43[6];
      auVar60._4_4_ = uVar4;
      auVar60._0_4_ = uVar4;
      auVar60._8_4_ = uVar4;
      auVar60._12_4_ = uVar4;
      auVar60._16_4_ = uVar4;
      auVar60._20_4_ = uVar4;
      auVar60._24_4_ = uVar4;
      auVar60._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)puVar43 + 0x3c);
      auVar55._4_4_ = uVar4;
      auVar55._0_4_ = uVar4;
      auVar55._8_4_ = uVar4;
      auVar55._12_4_ = uVar4;
      auVar55._16_4_ = uVar4;
      auVar55._20_4_ = uVar4;
      auVar55._24_4_ = uVar4;
      auVar55._28_4_ = uVar4;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *puVar43;
      auVar54 = vpmovzxbd_avx2(auVar68);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar37 = vfmadd213ps_fma(auVar54,auVar55,auVar60);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = puVar43[1];
      auVar54 = vpmovzxbd_avx2(auVar73);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar38 = vfmadd213ps_fma(auVar54,auVar55,auVar60);
      uVar4 = *(undefined4 *)((long)puVar43 + 0x34);
      auVar51._4_4_ = uVar4;
      auVar51._0_4_ = uVar4;
      auVar51._8_4_ = uVar4;
      auVar51._12_4_ = uVar4;
      auVar51._16_4_ = uVar4;
      auVar51._20_4_ = uVar4;
      auVar51._24_4_ = uVar4;
      auVar51._28_4_ = uVar4;
      uVar4 = (undefined4)puVar43[8];
      auVar67._4_4_ = uVar4;
      auVar67._0_4_ = uVar4;
      auVar67._8_4_ = uVar4;
      auVar67._12_4_ = uVar4;
      auVar67._16_4_ = uVar4;
      auVar67._20_4_ = uVar4;
      auVar67._24_4_ = uVar4;
      auVar67._28_4_ = uVar4;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = puVar43[2];
      auVar54 = vpmovzxbd_avx2(auVar6);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar6 = vfmadd213ps_fma(auVar54,auVar67,auVar51);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = puVar43[3];
      auVar54 = vpmovzxbd_avx2(auVar7);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar7 = vfmadd213ps_fma(auVar54,auVar67,auVar51);
      uVar4 = (undefined4)puVar43[7];
      auVar52._4_4_ = uVar4;
      auVar52._0_4_ = uVar4;
      auVar52._8_4_ = uVar4;
      auVar52._12_4_ = uVar4;
      auVar52._16_4_ = uVar4;
      auVar52._20_4_ = uVar4;
      auVar52._24_4_ = uVar4;
      auVar52._28_4_ = uVar4;
      uVar4 = *(undefined4 *)((long)puVar43 + 0x44);
      auVar57._4_4_ = uVar4;
      auVar57._0_4_ = uVar4;
      auVar57._8_4_ = uVar4;
      auVar57._12_4_ = uVar4;
      auVar57._16_4_ = uVar4;
      auVar57._20_4_ = uVar4;
      auVar57._24_4_ = uVar4;
      auVar57._28_4_ = uVar4;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = puVar43[4];
      auVar54 = vpmovzxbd_avx2(auVar8);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar8 = vfmadd213ps_fma(auVar54,auVar57,auVar52);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = puVar43[5];
      auVar54 = vpmovzxbd_avx2(auVar9);
      auVar54 = vcvtdq2ps_avx(auVar54);
      auVar9 = vfmadd213ps_fma(auVar54,auVar57,auVar52);
      auVar54 = vmaxps_avx(auVar76,ZEXT1632(auVar37));
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar38));
      auVar60 = vsubps_avx(auVar54,auVar76);
      auVar54 = vmaxps_avx(auVar77,ZEXT1632(auVar6));
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar7));
      auVar51 = vsubps_avx(auVar54,auVar77);
      auVar54 = vmaxps_avx(auVar78,ZEXT1632(auVar8));
      auVar54 = vminps_avx(auVar54,ZEXT1632(auVar9));
      auVar54 = vsubps_avx(auVar54,auVar78);
      auVar61._0_4_ =
           auVar60._0_4_ * auVar60._0_4_ + auVar51._0_4_ * auVar51._0_4_ +
           auVar54._0_4_ * auVar54._0_4_;
      auVar61._4_4_ =
           auVar60._4_4_ * auVar60._4_4_ + auVar51._4_4_ * auVar51._4_4_ +
           auVar54._4_4_ * auVar54._4_4_;
      auVar61._8_4_ =
           auVar60._8_4_ * auVar60._8_4_ + auVar51._8_4_ * auVar51._8_4_ +
           auVar54._8_4_ * auVar54._8_4_;
      auVar61._12_4_ =
           auVar60._12_4_ * auVar60._12_4_ + auVar51._12_4_ * auVar51._12_4_ +
           auVar54._12_4_ * auVar54._12_4_;
      auVar61._16_4_ =
           auVar60._16_4_ * auVar60._16_4_ + auVar51._16_4_ * auVar51._16_4_ +
           auVar54._16_4_ * auVar54._16_4_;
      auVar61._20_4_ =
           auVar60._20_4_ * auVar60._20_4_ + auVar51._20_4_ * auVar51._20_4_ +
           auVar54._20_4_ * auVar54._20_4_;
      auVar61._24_4_ =
           auVar60._24_4_ * auVar60._24_4_ + auVar51._24_4_ * auVar51._24_4_ +
           auVar54._24_4_ * auVar54._24_4_;
      auVar61._28_4_ = auVar60._28_4_ + auVar51._28_4_ + auVar51._28_4_;
      uVar28 = vcmpps_avx512vl(ZEXT1632(auVar37),ZEXT1632(auVar38),2);
      uVar34 = vpcmpub_avx512vl(auVar68,auVar73,2);
      uVar29 = vcmpps_avx512vl(auVar61,auVar81._0_32_,2);
      bVar44 = (byte)uVar28 & (byte)uVar29 & (byte)uVar34;
      goto LAB_01c79ce4;
    }
LAB_01c7a0e6:
    lVar49 = (sVar48 & 0xfffffffffffffff0) + 0x50;
    bVar44 = 0;
    lVar42 = 0;
    while (in_ZMM15 = ZEXT3264(auVar81._0_32_), lVar42 != (ulong)((uint)sVar48 & 0xf) - 8) {
      bVar47 = 0;
      for (lVar45 = 0; (lVar45 != 4 && (*(int *)(lVar49 + lVar45 * 4) != -1)); lVar45 = lVar45 + 1)
      {
        uVar12 = *(uint *)(lVar49 + -0x10 + lVar45 * 4);
        this = (context->scene->geometries).items[uVar12].ptr;
        context->geomID = uVar12;
        context->primID = *(uint *)(lVar49 + lVar45 * 4);
        bVar50 = Geometry::pointQuery(this,query,context);
        bVar47 = bVar47 | bVar50;
      }
      bVar44 = bVar44 | bVar47;
      lVar42 = lVar42 + 1;
      lVar49 = lVar49 + 0x60;
      auVar54 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar79 = ZEXT3264(auVar54);
      auVar80 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
    }
    if (bVar44 == 0) goto LAB_01c79bbd;
    uVar4 = *(undefined4 *)&(context->query_radius).field_0;
    auVar59._4_4_ = uVar4;
    auVar59._0_4_ = uVar4;
    auVar59._8_4_ = uVar4;
    auVar59._12_4_ = uVar4;
    auVar59._16_4_ = uVar4;
    auVar59._20_4_ = uVar4;
    auVar59._24_4_ = uVar4;
    auVar59._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar65._4_4_ = uVar4;
    auVar65._0_4_ = uVar4;
    auVar65._8_4_ = uVar4;
    auVar65._12_4_ = uVar4;
    auVar65._16_4_ = uVar4;
    auVar65._20_4_ = uVar4;
    auVar65._24_4_ = uVar4;
    auVar65._28_4_ = uVar4;
    uVar4 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar54._4_4_ = uVar4;
    auVar54._0_4_ = uVar4;
    auVar54._8_4_ = uVar4;
    auVar54._12_4_ = uVar4;
    auVar54._16_4_ = uVar4;
    auVar54._20_4_ = uVar4;
    auVar54._24_4_ = uVar4;
    auVar54._28_4_ = uVar4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_24e8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_24e8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    bVar41 = true;
  } while( true );
LAB_01c79e8a:
  auVar51 = vpshufd_avx2(auVar53,0x55);
  vpermt2q_avx512vl(auVar54,auVar51,auVar60);
  auVar52 = vpminsd_avx2(auVar53,auVar51);
  auVar51 = vpmaxsd_avx2(auVar53,auVar51);
  bVar44 = bVar44 - 1 & bVar44;
  if (bVar44 == 0) {
    auVar52 = vpermi2q_avx512vl(auVar52,auVar54,auVar60);
    sVar48 = auVar52._0_8_;
    auVar54 = vpermt2q_avx512vl(auVar54,auVar51,auVar60);
    (pSVar46->ptr).ptr = auVar54._0_8_;
    lVar42 = 8;
    lStack_2500 = 0x10;
  }
  else {
    auVar67 = vpshufd_avx2(auVar53,0xaa);
    vpermt2q_avx512vl(auVar54,auVar67,auVar60);
    auVar55 = vpminsd_avx2(auVar52,auVar67);
    auVar52 = vpmaxsd_avx2(auVar52,auVar67);
    auVar67 = vpminsd_avx2(auVar51,auVar52);
    auVar52 = vpmaxsd_avx2(auVar51,auVar52);
    bVar44 = bVar44 - 1 & bVar44;
    if (bVar44 == 0) {
      auVar51 = vpermi2q_avx512vl(auVar55,auVar54,auVar60);
      sVar48 = auVar51._0_8_;
      auVar51 = vpermt2q_avx512vl(auVar54,auVar52,auVar60);
      (pSVar46->ptr).ptr = auVar51._0_8_;
      auVar51 = vpermd_avx2(auVar52,auVar61);
      pSVar46->dist = auVar51._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar67,auVar60);
      pSVar46[1].ptr.ptr = auVar54._0_8_;
      lStack_2500 = 0x18;
      lVar42 = lStack_2500;
      lStack_2500 = 0x20;
      auVar51 = auVar67;
    }
    else {
      auVar51 = vpshufd_avx2(auVar53,0xff);
      vpermt2q_avx512vl(auVar54,auVar51,auVar60);
      auVar57 = vpminsd_avx2(auVar55,auVar51);
      auVar55 = vpmaxsd_avx2(auVar55,auVar51);
      auVar51 = vpminsd_avx2(auVar67,auVar55);
      auVar55 = vpmaxsd_avx2(auVar67,auVar55);
      auVar67 = vpminsd_avx2(auVar52,auVar55);
      auVar52 = vpmaxsd_avx2(auVar52,auVar55);
      bVar44 = bVar44 - 1 & bVar44;
      if (bVar44 != 0) {
        auVar56 = valignd_avx512vl(auVar53,auVar53,3);
        auVar55 = vpmovsxbd_avx2(ZEXT816(0x303020108));
        auVar57 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                       CONCAT48(0x80000000,0x8000000080000000))),
                                    auVar55,auVar57);
        auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
        auVar51 = vpermt2d_avx512vl(auVar57,auVar55,auVar51);
        auVar55 = vpermt2d_avx512vl(auVar51,auVar55,auVar67);
        auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
        auVar51 = vpermt2d_avx512vl(auVar55,auVar51,auVar52);
        auVar75 = ZEXT3264(auVar51);
        bVar47 = bVar44;
        do {
          auVar52 = auVar75._0_32_;
          auVar74._8_4_ = 1;
          auVar74._0_8_ = 0x100000001;
          auVar74._12_4_ = 1;
          auVar74._16_4_ = 1;
          auVar74._20_4_ = 1;
          auVar74._24_4_ = 1;
          auVar74._28_4_ = 1;
          auVar51 = vpermd_avx2(auVar74,auVar56);
          auVar56 = valignd_avx512vl(auVar56,auVar56,1);
          vpermt2q_avx512vl(auVar54,auVar56,auVar60);
          bVar47 = bVar47 - 1 & bVar47;
          uVar28 = vpcmpd_avx512vl(auVar51,auVar52,5);
          auVar51 = vpmaxsd_avx2(auVar51,auVar52);
          bVar36 = (byte)uVar28 << 1;
          auVar52 = valignd_avx512vl(auVar52,auVar52,7);
          bVar50 = (bool)((byte)uVar28 & 1);
          bVar13 = (bool)(bVar36 >> 2 & 1);
          bVar14 = (bool)(bVar36 >> 3 & 1);
          bVar15 = (bool)(bVar36 >> 4 & 1);
          bVar16 = (bool)(bVar36 >> 5 & 1);
          bVar17 = (bool)(bVar36 >> 6 & 1);
          auVar75 = ZEXT3264(CONCAT428((uint)(bVar36 >> 7) * auVar52._28_4_ |
                                       (uint)!(bool)(bVar36 >> 7) * auVar51._28_4_,
                                       CONCAT424((uint)bVar17 * auVar52._24_4_ |
                                                 (uint)!bVar17 * auVar51._24_4_,
                                                 CONCAT420((uint)bVar16 * auVar52._20_4_ |
                                                           (uint)!bVar16 * auVar51._20_4_,
                                                           CONCAT416((uint)bVar15 * auVar52._16_4_ |
                                                                     (uint)!bVar15 * auVar51._16_4_,
                                                                     CONCAT412((uint)bVar14 *
                                                                               auVar52._12_4_ |
                                                                               (uint)!bVar14 *
                                                                               auVar51._12_4_,
                                                                               CONCAT48((uint)bVar13
                                                                                        * auVar52.
                                                  _8_4_ | (uint)!bVar13 * auVar51._8_4_,
                                                  CONCAT44((uint)bVar50 * auVar52._4_4_ |
                                                           (uint)!bVar50 * auVar51._4_4_,
                                                           auVar51._0_4_))))))));
        } while (bVar47 != 0);
        lVar42 = (ulong)(uint)POPCOUNT((uint)bVar44) + 3;
        while( true ) {
          auVar52 = auVar75._0_32_;
          auVar51 = vpermt2q_avx512vl(auVar54,auVar52,auVar60);
          sVar48 = auVar51._0_8_;
          bVar50 = lVar42 == 0;
          lVar42 = lVar42 + -1;
          if (bVar50) break;
          (pSVar46->ptr).ptr = sVar48;
          auVar51 = vpermd_avx2(auVar52,auVar61);
          pSVar46->dist = auVar51._0_4_;
          auVar51 = valignd_avx512vl(auVar52,auVar52,1);
          auVar75 = ZEXT3264(auVar51);
          pSVar46 = pSVar46 + 1;
        }
        goto LAB_01c79bdb;
      }
      auVar55 = vpermi2q_avx512vl(auVar57,auVar54,auVar60);
      sVar48 = auVar55._0_8_;
      auVar55 = vpermt2q_avx512vl(auVar54,auVar52,auVar60);
      (pSVar46->ptr).ptr = auVar55._0_8_;
      auVar52 = vpermd_avx2(auVar52,auVar61);
      pSVar46->dist = auVar52._0_4_;
      auVar52 = vpermt2q_avx512vl(auVar54,auVar67,auVar60);
      pSVar46[1].ptr.ptr = auVar52._0_8_;
      auVar52 = vpermd_avx2(auVar67,auVar61);
      pSVar46[1].dist = auVar52._0_4_;
      auVar54 = vpermt2q_avx512vl(auVar54,auVar51,auVar60);
      pSVar46[2].ptr.ptr = auVar54._0_8_;
      lVar42 = 0x28;
      lStack_2500 = 0x30;
    }
  }
  auVar54 = vpermd_avx2(auVar51,auVar61);
  *(int *)((long)&(pSVar46->ptr).ptr + lVar42) = auVar54._0_4_;
  pSVar46 = (StackItemT<embree::NodeRefPtr<8>_> *)((long)&(pSVar46->ptr).ptr + lStack_2500);
  goto LAB_01c79bdb;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }